

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils_test.cpp
# Opt level: O1

void __thiscall
ot::commissioner::UtilsTest_IntegerEncodingDecoding_8BitsInteger_Test::TestBody
          (UtilsTest_IntegerEncodingDecoding_8BitsInteger_Test *this)

{
  undefined8 *puVar1;
  pointer puVar2;
  char *pcVar3;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  AssertionResult gtest_ar;
  ByteArray buf;
  allocator_type local_61;
  AssertHelper local_60;
  ByteArray local_58;
  internal local_38 [8];
  undefined8 *local_30;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  utils::Encode<unsigned_char>(&local_58,0xfc);
  puVar2 = local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  if ((long *)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (long *)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  local_60.data_._0_2_ = CONCAT11(local_60.data_._1_1_,0xfc);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_60;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_58,__l,&local_61);
  testing::internal::
  CmpHelperEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (local_38,"buf","(ByteArray{0xFC})",&local_28,&local_58);
  if ((long *)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (long *)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_30 == (undefined8 *)0x0) {
      pcVar3 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar3 = (char *)*local_30;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/utils_test.cpp"
               ,0x2f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((long *)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (long *)0x0) {
      (**(code **)(*(long *)local_58.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  puVar1 = local_30;
  if (local_30 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_30 != local_30 + 2) {
      operator_delete((undefined8 *)*local_30);
    }
    operator_delete(puVar1);
  }
  utils::Encode<unsigned_char>(&local_28,0xfb);
  local_60.data_._0_2_ = 0xfbfc;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_60;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_58,__l_00,&local_61);
  testing::internal::
  CmpHelperEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (local_38,"buf","(ByteArray{0xFC, 0xFB})",&local_28,&local_58);
  if ((long *)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (long *)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_30 == (undefined8 *)0x0) {
      pcVar3 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar3 = (char *)*local_30;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/utils_test.cpp"
               ,0x32,pcVar3);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((long *)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (long *)0x0) {
      (**(code **)(*(long *)local_58.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  puVar1 = local_30;
  if (local_30 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_30 != local_30 + 2) {
      operator_delete((undefined8 *)*local_30);
    }
    operator_delete(puVar1);
  }
  utils::Encode<signed_char>(&local_58,-3);
  if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_60.data_._0_2_ =
         CONCAT11(local_60.data_._1_1_,
                  *local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start);
    local_61 = (allocator_type)0xfd;
    testing::internal::CmpHelperEQ<signed_char,signed_char>
              (local_38,"utils::Decode<int8_t>(utils::Encode<int8_t>(0xFD))",
               "static_cast<int8_t>(0xFD)",(char *)&local_60,(char *)&local_61);
    if ((long *)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (long *)0x0) {
      operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_38[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_58);
      if (local_30 == (undefined8 *)0x0) {
        pcVar3 = anon_var_dwarf_434f87 + 9;
      }
      else {
        pcVar3 = (char *)*local_30;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/utils_test.cpp"
                 ,0x34,pcVar3);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if ((long *)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start != (long *)0x0) {
        (**(code **)(*(long *)local_58.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    if (local_30 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_30 != local_30 + 2) {
        operator_delete((undefined8 *)*local_30);
      }
      operator_delete(local_30);
    }
    if (local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  __assert_fail("condition",
                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/utils.hpp"
                ,0xa2,"T ot::commissioner::utils::Decode(const uint8_t *, size_t) [T = signed char]"
               );
}

Assistant:

TEST(UtilsTest, HexEncodingDecoding_EmptyStringDecodedIntoEmptyByteArray)
{
    ByteArray   buf;
    std::string hexStr;

    EXPECT_EQ(utils::Hex(buf, hexStr), ErrorCode::kNone);
    EXPECT_TRUE(buf.empty());
}